

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformfontdatabase.cpp
# Opt level: O0

void QPlatformFontDatabase::registerFont
               (QString *familyname,QString *stylename,QString *foundryname,Weight weight,
               Style style,Stretch stretch,bool antialiased,bool scalable,int pixelSize,
               bool fixedPitch,bool colorFont,QSupportedWritingSystems *writingSystems,void *usrPtr)

{
  QString *unaff_RBX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  QString *unaff_R14;
  QString *unaff_R15;
  int in_stack_00000090;
  QSupportedWritingSystems *in_stack_000000a8;
  void *in_stack_000000b0;
  
  qt_registerFont(unaff_R15,unaff_R14,unaff_RBX,(int)((ulong)in_RDI >> 0x20),(Style)in_RDI,
                  (int)((ulong)in_RSI >> 0x20),SUB81((ulong)in_RSI >> 0x18,0),
                  SUB81((ulong)in_RSI >> 0x10,0),in_stack_00000090,SUB81((ulong)in_RSI >> 8,0),
                  SUB81(in_RSI,0),in_stack_000000a8,in_stack_000000b0);
  return;
}

Assistant:

void QPlatformFontDatabase::registerFont(const QString &familyname, const QString &stylename,
                                         const QString &foundryname, QFont::Weight weight,
                                         QFont::Style style, QFont::Stretch stretch, bool antialiased,
                                         bool scalable, int pixelSize, bool fixedPitch, bool colorFont,
                                         const QSupportedWritingSystems &writingSystems, void *usrPtr)
{
    if (scalable)
        pixelSize = 0;

    qt_registerFont(familyname, stylename, foundryname, weight, style,
                    stretch, antialiased, scalable, pixelSize,
                    fixedPitch, colorFont, writingSystems, usrPtr);
}